

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

path * __thiscall boost::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  size_type pos;
  allocator<char> local_19;
  
  pos = anon_unknown.dwarf_1dc47::filename_pos
                  (&this->m_pathname,(this->m_pathname)._M_string_length);
  if ((((pos != 0) && ((this->m_pathname)._M_string_length != 0)) &&
      ((this->m_pathname)._M_dataplus._M_p[pos] == '/')) &&
     (bVar1 = anon_unknown.dwarf_1dc47::is_root_separator(&this->m_pathname,pos), !bVar1)) {
    detail::dot_path();
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p,
               detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p +
               detail::dot_path::dot_pth.m_pathname._M_string_length);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(this->m_pathname)._M_dataplus._M_p + pos,&local_19);
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const
  {
    size_type pos(filename_pos(m_pathname, m_pathname.size()));
    return (m_pathname.size()
              && pos
              && is_separator(m_pathname[pos])
              && !is_root_separator(m_pathname, pos))
      ? detail::dot_path()
      : path(m_pathname.c_str() + pos);
  }